

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall kj::PathPtr::append(Path *__return_storage_ptr__,PathPtr *this,PathPtr suffix)

{
  undefined8 *puVar1;
  char *pcVar2;
  long lVar3;
  String *pSVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  String *pSVar10;
  String local_78;
  size_t local_60;
  Path *local_58;
  String *local_50;
  String *local_48;
  String *local_40;
  undefined8 *local_38;
  
  sVar5 = suffix.parts.size_;
  sVar7 = (this->parts).size_ + sVar5;
  local_58 = __return_storage_ptr__;
  pSVar4 = (String *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,sVar7,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_40 = pSVar4 + sVar7;
  local_38 = &kj::_::HeapArrayDisposer::instance;
  sVar7 = (this->parts).size_;
  pSVar10 = pSVar4;
  local_50 = pSVar4;
  local_48 = pSVar4;
  if (sVar7 != 0) {
    pSVar10 = (this->parts).ptr;
    lVar3 = 0;
    local_60 = sVar5;
    do {
      lVar9 = lVar3;
      pcVar2 = *(char **)((long)&(pSVar10->content).size_ + lVar9);
      pcVar8 = pcVar2;
      if (pcVar2 != (char *)0x0) {
        pcVar8 = *(char **)((long)&(pSVar10->content).ptr + lVar9);
      }
      pcVar6 = (char *)0x0;
      if (pcVar2 != (char *)0x0) {
        pcVar6 = pcVar2 + -1;
      }
      heapString(&local_78,pcVar8,(size_t)pcVar6);
      puVar1 = (undefined8 *)((long)&(pSVar4->content).ptr + lVar9);
      *puVar1 = local_78.content.ptr;
      puVar1[1] = local_78.content.size_;
      puVar1[2] = local_78.content.disposer;
      local_48 = (String *)(puVar1 + 3);
      lVar3 = lVar9 + 0x18;
    } while (sVar7 * 0x18 != lVar9 + 0x18);
    pSVar10 = (String *)((long)&pSVar4[1].content.ptr + lVar9);
    sVar5 = local_60;
  }
  if (sVar5 != 0) {
    lVar3 = 0;
    do {
      lVar9 = lVar3;
      pcVar2 = *(char **)((long)&((suffix.parts.ptr)->content).size_ + lVar9);
      pcVar8 = pcVar2;
      if (pcVar2 != (char *)0x0) {
        pcVar8 = *(char **)((long)&((suffix.parts.ptr)->content).ptr + lVar9);
      }
      pcVar6 = (char *)0x0;
      if (pcVar2 != (char *)0x0) {
        pcVar6 = pcVar2 + -1;
      }
      heapString(&local_78,pcVar8,(size_t)pcVar6);
      puVar1 = (undefined8 *)((long)&(pSVar10->content).ptr + lVar9);
      *puVar1 = local_78.content.ptr;
      puVar1[1] = local_78.content.size_;
      puVar1[2] = local_78.content.disposer;
      local_48 = (String *)(puVar1 + 3);
      lVar3 = lVar9 + 0x18;
    } while (sVar5 * 0x18 != lVar9 + 0x18);
    pSVar10 = (String *)((long)&pSVar10[1].content.ptr + lVar9);
  }
  (local_58->parts).ptr = pSVar4;
  (local_58->parts).size_ = ((long)pSVar10 - (long)pSVar4 >> 3) * -0x5555555555555555;
  (local_58->parts).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return local_58;
}

Assistant:

Path PathPtr::append(PathPtr suffix) const {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(heapString(p));
  for (auto& p: suffix.parts) newParts.add(heapString(p));
  return Path(newParts.finish(), Path::ALREADY_CHECKED);
}